

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

Node * __thiscall spoa::Graph::AddNode(Graph *this,uint32_t code)

{
  Node *local_20;
  
  local_20 = (Node *)operator_new(0x50);
  local_20->id = (uint32_t)
                 ((ulong)((long)(this->nodes_).
                                super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->nodes_).
                               super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_20->code = code;
  (local_20->aligned_nodes).
  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->inedges).super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->inedges).super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->inedges).super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->outedges).super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->outedges).super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->outedges).super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->aligned_nodes).
  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->aligned_nodes).
  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>,std::allocator<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>>>
  ::emplace_back<spoa::Graph::Node*>
            ((vector<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>,std::allocator<std::unique_ptr<spoa::Graph::Node,std::default_delete<spoa::Graph::Node>>>>
              *)&this->nodes_,&local_20);
  return (this->nodes_).
         super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
         super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
         super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
}

Assistant:

Graph::Node* Graph::AddNode(std::uint32_t code) {
  nodes_.emplace_back(new Node(nodes_.size(), code));
  return nodes_.back().get();
}